

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O3

void jtransform_execute_transform
               (j_decompress_ptr srcinfo,j_compress_ptr dstinfo,jvirt_barray_ptr *src_coef_arrays,
               jpeg_transform_info *info)

{
  int iVar1;
  jvirt_barray_ptr *ppjVar2;
  JBLOCKROW paJVar3;
  j_decompress_ptr pjVar4;
  jpeg_component_info *pjVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  short sVar13;
  int iVar14;
  uint uVar15;
  JDIMENSION JVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  JBLOCKARRAY ppaJVar20;
  JBLOCKARRAY ppaJVar21;
  jpeg_memory_mgr *pjVar22;
  JDIMENSION JVar23;
  JCROP_CODE JVar24;
  ulong uVar25;
  JBLOCKROW paJVar26;
  JDIMENSION JVar27;
  ulong uVar28;
  long lVar29;
  jvirt_barray_ptr pjVar30;
  uint uVar31;
  JCOEF *pJVar32;
  uint uVar33;
  int iVar34;
  uint uVar35;
  ulong uVar36;
  JCOEF *pJVar37;
  ulong uVar38;
  uint uVar39;
  int iVar40;
  uint uVar41;
  JCOEF *pJVar42;
  long lVar43;
  long lVar44;
  ulong uVar45;
  long lVar46;
  uint uVar47;
  JDIMENSION JVar48;
  JDIMENSION JVar49;
  uint uVar50;
  ulong uVar51;
  bool bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar70;
  undefined1 auVar69 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar73 [16];
  long local_e8;
  long local_d8;
  int local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  long local_78;
  
  if (info->transform < (JXFORM_WIPE|JXFORM_FLIP_V)) {
    ppjVar2 = info->workspace_coef_arrays;
    switch(info->transform) {
    case JXFORM_NONE:
      uVar41 = srcinfo->output_width;
      if (uVar41 < info->output_width) {
        if (info->crop_width_set == JCROP_FORCE) {
          do_crop_ext_flat(srcinfo,dstinfo,info->x_crop_offset,info->y_crop_offset,src_coef_arrays,
                           ppjVar2);
          return;
        }
        if (info->crop_width_set == JCROP_REFLECT) {
          do_crop_ext_reflect(srcinfo,dstinfo,info->x_crop_offset,info->y_crop_offset,
                              src_coef_arrays,ppjVar2);
          return;
        }
      }
      else if (info->output_height <= srcinfo->output_height) {
        if (info->x_crop_offset == 0 && info->y_crop_offset == 0) {
          return;
        }
        do_crop(srcinfo,dstinfo,info->x_crop_offset,info->y_crop_offset,src_coef_arrays,ppjVar2);
        return;
      }
      iVar17 = dstinfo->num_components;
      iVar70 = dstinfo->max_h_samp_factor;
      if (0 < iVar17) {
        JVar27 = info->x_crop_offset;
        JVar16 = info->y_crop_offset;
        uVar31 = srcinfo->output_height;
        iVar14 = dstinfo->max_v_samp_factor;
        lVar46 = 0;
        do {
          pjVar5 = dstinfo->comp_info;
          if (pjVar5[lVar46].height_in_blocks != 0) {
            uVar18 = pjVar5[lVar46].v_samp_factor;
            uVar25 = (ulong)uVar18;
            uVar50 = pjVar5[lVar46].h_samp_factor * (uVar41 / (uint)(iVar70 << 3));
            uVar47 = uVar18 * JVar16;
            uVar15 = pjVar5[lVar46].h_samp_factor * JVar27;
            uVar36 = (ulong)uVar15;
            uVar15 = uVar15 + uVar50;
            uVar35 = 0;
            do {
              ppaJVar20 = (*srcinfo->mem->access_virt_barray)
                                    ((j_common_ptr)srcinfo,ppjVar2[lVar46],uVar35,(JDIMENSION)uVar25
                                     ,1);
              if (srcinfo->output_height < dstinfo->image_height) {
                if ((uVar47 <= uVar35) &&
                   (uVar35 < uVar18 * (uVar31 / (uint)(iVar14 << 3) + JVar16))) {
                  pjVar22 = srcinfo->mem;
                  pjVar30 = src_coef_arrays[lVar46];
                  uVar33 = -uVar47;
                  goto LAB_001069ef;
                }
                uVar25 = (ulong)(uint)pjVar5[lVar46].v_samp_factor;
                if (0 < pjVar5[lVar46].v_samp_factor) {
                  lVar29 = 0;
                  do {
                    memset(ppaJVar20[lVar29],0,(ulong)pjVar5[lVar46].width_in_blocks << 7);
                    lVar29 = lVar29 + 1;
                    uVar25 = (ulong)pjVar5[lVar46].v_samp_factor;
                  } while (lVar29 < (long)uVar25);
                }
              }
              else {
                pjVar22 = srcinfo->mem;
                pjVar30 = src_coef_arrays[lVar46];
                uVar33 = uVar47;
LAB_001069ef:
                ppaJVar21 = (*pjVar22->access_virt_barray)
                                      ((j_common_ptr)srcinfo,pjVar30,uVar35 + uVar33,
                                       pjVar5[lVar46].v_samp_factor,0);
                uVar25 = (ulong)(uint)pjVar5[lVar46].v_samp_factor;
                if (0 < pjVar5[lVar46].v_samp_factor) {
                  lVar29 = 0;
                  do {
                    if (srcinfo->output_width < dstinfo->image_width) {
                      if (uVar36 != 0) {
                        memset(ppaJVar20[lVar29],0,uVar36 * 0x80);
                      }
                      jcopy_block_row(ppaJVar21[lVar29],ppaJVar20[lVar29] + uVar36,uVar50);
                      uVar33 = pjVar5[lVar46].width_in_blocks - uVar15;
                      if (uVar15 <= pjVar5[lVar46].width_in_blocks && uVar33 != 0) {
                        memset(ppaJVar20[lVar29] + uVar36 + uVar50,0,(ulong)uVar33 << 7);
                      }
                    }
                    else {
                      jcopy_block_row(ppaJVar21[lVar29] + uVar36,ppaJVar20[lVar29],
                                      pjVar5[lVar46].width_in_blocks);
                    }
                    lVar29 = lVar29 + 1;
                    uVar25 = (ulong)pjVar5[lVar46].v_samp_factor;
                  } while (lVar29 < (long)uVar25);
                }
              }
              uVar35 = uVar35 + (int)uVar25;
            } while (uVar35 < pjVar5[lVar46].height_in_blocks);
            iVar17 = dstinfo->num_components;
          }
          lVar46 = lVar46 + 1;
        } while (lVar46 < iVar17);
      }
      break;
    case JXFORM_FLIP_H:
      JVar27 = info->y_crop_offset;
      if ((JVar27 == 0) && (info->slow_hflip == 0)) {
        do_flip_h_no_crop(srcinfo,dstinfo,info->x_crop_offset,src_coef_arrays);
        return;
      }
      uVar41 = srcinfo->output_width;
      iVar17 = dstinfo->num_components;
      iVar70 = dstinfo->max_h_samp_factor;
      if (0 < iVar17) {
        JVar16 = info->x_crop_offset;
        lVar46 = 0;
        do {
          pjVar5 = dstinfo->comp_info;
          if (pjVar5[lVar46].height_in_blocks != 0) {
            JVar23 = pjVar5[lVar46].v_samp_factor;
            uVar18 = pjVar5[lVar46].h_samp_factor * (uVar41 / (uint)(iVar70 << 3));
            uVar31 = pjVar5[lVar46].h_samp_factor * JVar16;
            iVar17 = JVar23 * JVar27;
            JVar48 = 0;
            do {
              ppaJVar20 = (*srcinfo->mem->access_virt_barray)
                                    ((j_common_ptr)srcinfo,ppjVar2[lVar46],JVar48,JVar23,1);
              ppaJVar21 = (*srcinfo->mem->access_virt_barray)
                                    ((j_common_ptr)srcinfo,src_coef_arrays[lVar46],JVar48 + iVar17,
                                     pjVar5[lVar46].v_samp_factor,0);
              JVar23 = pjVar5[lVar46].v_samp_factor;
              if (0 < (int)JVar23) {
                uVar50 = pjVar5[lVar46].width_in_blocks;
                lVar29 = 0;
                uVar47 = uVar50;
                do {
                  if (uVar47 == 0) {
                    uVar47 = 0;
                  }
                  else {
                    paJVar26 = ppaJVar20[lVar29];
                    paJVar3 = ppaJVar21[lVar29];
                    uVar25 = 0;
                    do {
                      uVar47 = uVar31 + (int)uVar25;
                      if (uVar47 < uVar18) {
                        pJVar37 = paJVar26[uVar25];
                        pJVar32 = paJVar3[~uVar47 + uVar18];
                        uVar47 = 0xfffffffe;
                        do {
                          *pJVar37 = *pJVar32;
                          pJVar37[1] = -pJVar32[1];
                          pJVar37 = pJVar37 + 2;
                          uVar47 = uVar47 + 2;
                          pJVar32 = pJVar32 + 2;
                        } while (uVar47 < 0x3e);
                      }
                      else {
                        jcopy_block_row(paJVar3 + uVar31 + uVar25,paJVar26 + uVar25,1);
                        uVar50 = pjVar5[lVar46].width_in_blocks;
                      }
                      uVar25 = uVar25 + 1;
                    } while (uVar25 < uVar50);
                    JVar23 = pjVar5[lVar46].v_samp_factor;
                    uVar47 = uVar50;
                  }
                  lVar29 = lVar29 + 1;
                } while (lVar29 < (int)JVar23);
              }
              JVar48 = JVar48 + JVar23;
            } while (JVar48 < pjVar5[lVar46].height_in_blocks);
            iVar17 = dstinfo->num_components;
          }
          lVar46 = lVar46 + 1;
        } while (lVar46 < iVar17);
      }
      break;
    case JXFORM_FLIP_V:
      uVar41 = srcinfo->output_height;
      iVar17 = dstinfo->num_components;
      iVar70 = dstinfo->max_v_samp_factor;
      if (0 < iVar17) {
        JVar27 = info->x_crop_offset;
        JVar16 = info->y_crop_offset;
        lVar46 = 0;
        do {
          pjVar5 = dstinfo->comp_info;
          if (pjVar5[lVar46].height_in_blocks != 0) {
            JVar23 = pjVar5[lVar46].v_samp_factor;
            uVar31 = JVar23 * (uVar41 / (uint)(iVar70 << 3));
            iVar17 = JVar23 * JVar16;
            uVar25 = (ulong)(pjVar5[lVar46].h_samp_factor * JVar27);
            JVar48 = 0;
            do {
              ppaJVar20 = (*srcinfo->mem->access_virt_barray)
                                    ((j_common_ptr)srcinfo,ppjVar2[lVar46],JVar48,JVar23,1);
              uVar18 = JVar48 + iVar17;
              JVar23 = (uVar31 - uVar18) - pjVar5[lVar46].v_samp_factor;
              if (uVar31 <= uVar18) {
                JVar23 = uVar18;
              }
              ppaJVar21 = (*srcinfo->mem->access_virt_barray)
                                    ((j_common_ptr)srcinfo,src_coef_arrays[lVar46],JVar23,
                                     pjVar5[lVar46].v_samp_factor,0);
              JVar23 = pjVar5[lVar46].v_samp_factor;
              if (0 < (int)JVar23) {
                lVar29 = 0;
                do {
                  if (uVar18 < uVar31) {
                    uVar50 = pjVar5[lVar46].width_in_blocks;
                    if ((ulong)uVar50 != 0) {
                      paJVar26 = ppaJVar20[lVar29];
                      paJVar3 = ppaJVar21[(int)(~(uint)lVar29 + JVar23)];
                      uVar36 = 0;
                      do {
                        pJVar32 = paJVar26[uVar36];
                        pJVar37 = paJVar3[uVar25 + uVar36];
                        uVar47 = 0;
                        do {
                          lVar44 = 0;
                          lVar43 = 0;
                          do {
                            pJVar32[lVar43] = pJVar37[lVar43];
                            lVar43 = lVar43 + 1;
                            lVar44 = lVar44 + -2;
                          } while ((int)lVar43 != 8);
                          pJVar32 = (JCOEF *)((long)pJVar32 - lVar44);
                          pJVar37 = (JCOEF *)((long)pJVar37 - lVar44);
                          iVar14 = 8;
                          do {
                            sVar13 = *pJVar37;
                            pJVar37 = pJVar37 + 1;
                            *pJVar32 = -sVar13;
                            pJVar32 = pJVar32 + 1;
                            iVar14 = iVar14 + -1;
                          } while (iVar14 != 0);
                          bVar52 = uVar47 < 6;
                          uVar47 = uVar47 + 2;
                        } while (bVar52);
                        uVar36 = uVar36 + 1;
                      } while (uVar36 != uVar50);
                    }
                  }
                  else {
                    jcopy_block_row(ppaJVar21[lVar29] + uVar25,ppaJVar20[lVar29],
                                    pjVar5[lVar46].width_in_blocks);
                    JVar23 = pjVar5[lVar46].v_samp_factor;
                  }
                  lVar29 = lVar29 + 1;
                } while (lVar29 < (int)JVar23);
              }
              JVar48 = JVar48 + JVar23;
            } while (JVar48 < pjVar5[lVar46].height_in_blocks);
            iVar17 = dstinfo->num_components;
          }
          lVar46 = lVar46 + 1;
        } while (lVar46 < iVar17);
      }
      break;
    case JXFORM_TRANSPOSE:
      iVar17 = dstinfo->num_components;
      if (0 < iVar17) {
        JVar27 = info->x_crop_offset;
        JVar16 = info->y_crop_offset;
        lVar46 = 0;
        do {
          pjVar5 = dstinfo->comp_info;
          if (pjVar5[lVar46].height_in_blocks != 0) {
            iVar17 = pjVar5[lVar46].h_samp_factor;
            JVar23 = pjVar5[lVar46].v_samp_factor;
            iVar70 = JVar23 * JVar16;
            JVar48 = 0;
            do {
              ppaJVar20 = (*srcinfo->mem->access_virt_barray)
                                    ((j_common_ptr)srcinfo,ppjVar2[lVar46],JVar48,JVar23,1);
              JVar23 = pjVar5[lVar46].v_samp_factor;
              if (0 < (int)JVar23) {
                uVar41 = pjVar5[lVar46].width_in_blocks;
                uVar31 = iVar70 + JVar48;
                lVar29 = 0;
                do {
                  if (uVar41 == 0) {
                    uVar41 = 0;
                  }
                  else {
                    uVar25 = (ulong)(uint)pjVar5[lVar46].h_samp_factor;
                    uVar36 = 0;
                    do {
                      iVar40 = (int)uVar36;
                      ppaJVar21 = (*srcinfo->mem->access_virt_barray)
                                            ((j_common_ptr)srcinfo,src_coef_arrays[lVar46],
                                             iVar17 * JVar27 + iVar40,(JDIMENSION)uVar25,0);
                      iVar14 = pjVar5[lVar46].h_samp_factor;
                      uVar25 = (ulong)iVar14;
                      if (0 < (long)uVar25) {
                        paJVar26 = ppaJVar20[lVar29];
                        uVar38 = 0;
                        do {
                          pJVar32 = paJVar26[uVar36];
                          pJVar37 = ppaJVar21[uVar38][uVar31];
                          lVar44 = 0;
                          do {
                            lVar43 = 0;
                            do {
                              pJVar32[lVar43 * 4] = *(JCOEF *)((long)pJVar37 + lVar43);
                              lVar43 = lVar43 + 2;
                            } while (lVar43 != 0x10);
                            lVar44 = lVar44 + 1;
                            pJVar32 = pJVar32 + 1;
                            pJVar37 = pJVar37 + 8;
                          } while (lVar44 != 8);
                          uVar38 = uVar38 + 1;
                          uVar36 = (ulong)((int)uVar36 + 1);
                        } while (uVar38 != uVar25);
                      }
                      uVar18 = iVar40 + iVar14;
                      uVar36 = (ulong)uVar18;
                      uVar41 = pjVar5[lVar46].width_in_blocks;
                    } while (uVar18 < uVar41);
                    JVar23 = pjVar5[lVar46].v_samp_factor;
                  }
                  lVar29 = lVar29 + 1;
                  uVar31 = uVar31 + 1;
                } while (lVar29 < (int)JVar23);
              }
              JVar48 = JVar48 + JVar23;
            } while (JVar48 < pjVar5[lVar46].height_in_blocks);
            iVar17 = dstinfo->num_components;
          }
          lVar46 = lVar46 + 1;
        } while (lVar46 < iVar17);
      }
      break;
    case JXFORM_TRANSVERSE:
      uVar41 = srcinfo->output_width;
      uVar31 = srcinfo->output_height;
      iVar17 = dstinfo->num_components;
      iVar70 = dstinfo->max_h_samp_factor;
      iVar14 = dstinfo->max_v_samp_factor;
      if (0 < iVar17) {
        JVar27 = info->x_crop_offset;
        JVar16 = info->y_crop_offset;
        lVar46 = 0;
        do {
          pjVar5 = dstinfo->comp_info;
          if (pjVar5[lVar46].height_in_blocks != 0) {
            iVar17 = pjVar5[lVar46].h_samp_factor;
            JVar23 = pjVar5[lVar46].v_samp_factor;
            uVar18 = iVar17 * (uVar31 / (uint)(iVar70 << 3));
            uVar50 = JVar23 * (uVar41 / (uint)(iVar14 << 3));
            iVar40 = JVar23 * JVar16;
            JVar48 = 0;
            do {
              ppaJVar20 = (*srcinfo->mem->access_virt_barray)
                                    ((j_common_ptr)srcinfo,ppjVar2[lVar46],JVar48,JVar23,1);
              JVar23 = pjVar5[lVar46].v_samp_factor;
              if (0 < (int)JVar23) {
                uVar35 = JVar48 + iVar40;
                uVar47 = pjVar5[lVar46].width_in_blocks;
                local_78 = 0;
                uVar15 = uVar35;
                do {
                  if (uVar47 == 0) {
                    uVar47 = 0;
                  }
                  else {
                    uVar33 = ~(uVar35 + (int)local_78) + uVar50;
                    uVar25 = (ulong)(uint)pjVar5[lVar46].h_samp_factor;
                    uVar36 = 0;
                    do {
                      iVar34 = (int)uVar36;
                      uVar47 = iVar34 + iVar17 * JVar27;
                      JVar23 = (uVar18 - uVar47) - (JDIMENSION)uVar25;
                      if (uVar18 <= uVar47) {
                        JVar23 = uVar47;
                      }
                      ppaJVar21 = (*srcinfo->mem->access_virt_barray)
                                            ((j_common_ptr)srcinfo,src_coef_arrays[lVar46],JVar23,
                                             (JDIMENSION)uVar25,0);
                      iVar1 = pjVar5[lVar46].h_samp_factor;
                      uVar25 = (ulong)iVar1;
                      if (0 < (long)uVar25) {
                        paJVar26 = ppaJVar20[local_78];
                        uVar38 = 0;
                        do {
                          if (uVar35 < uVar50) {
                            if (uVar47 < uVar18) {
                              pJVar32 = paJVar26[uVar36] + 9;
                              pJVar37 = paJVar26[uVar36] + 8;
                              paJVar3 = ppaJVar21[uVar25 + ~uVar38];
                              uVar45 = 0;
                              do {
                                uVar51 = 0xfffffffffffffffe;
                                uVar28 = 0;
                                pJVar42 = pJVar37;
                                do {
                                  uVar19 = uVar28 | uVar45 * 8;
                                  (*(JBLOCK *)(pJVar42 + -8))[0] = paJVar3[uVar33][uVar19];
                                  *pJVar42 = -*(short *)((long)paJVar3[uVar33] + (uVar19 * 2 | 2));
                                  uVar28 = uVar28 + 2;
                                  uVar51 = uVar51 + 2;
                                  pJVar42 = pJVar42 + 0x10;
                                } while (uVar51 < 6);
                                uVar28 = 0xfffffffffffffffe;
                                uVar51 = 0;
                                pJVar42 = pJVar32;
                                do {
                                  uVar19 = uVar51 | uVar45 * 8 + 8;
                                  pJVar42[-8] = -paJVar3[uVar33][uVar19];
                                  *pJVar42 = *(JCOEF *)((long)paJVar3[uVar33] + (uVar19 * 2 | 2));
                                  uVar51 = uVar51 + 2;
                                  uVar28 = uVar28 + 2;
                                  pJVar42 = pJVar42 + 0x10;
                                } while (uVar28 < 6);
                                pJVar37 = pJVar37 + 2;
                                pJVar32 = pJVar32 + 2;
                                bVar52 = uVar45 < 6;
                                uVar45 = uVar45 + 2;
                              } while (bVar52);
                            }
                            else {
                              pJVar32 = paJVar26[uVar36] + 8;
                              paJVar3 = ppaJVar21[uVar38];
                              lVar29 = 0;
                              do {
                                uVar51 = 0xfffffffffffffffe;
                                uVar45 = 0;
                                pJVar37 = pJVar32;
                                do {
                                  uVar28 = uVar45 | lVar29 * 8;
                                  (*(JBLOCK *)(pJVar37 + -8))[0] = paJVar3[uVar33][uVar28];
                                  *pJVar37 = -*(short *)((long)paJVar3[uVar33] + (uVar28 * 2 | 2));
                                  uVar45 = uVar45 + 2;
                                  uVar51 = uVar51 + 2;
                                  pJVar37 = pJVar37 + 0x10;
                                } while (uVar51 < 6);
                                lVar29 = lVar29 + 1;
                                pJVar32 = pJVar32 + 1;
                              } while (lVar29 != 8);
                            }
                          }
                          else {
                            pJVar32 = paJVar26[uVar36];
                            if (uVar47 < uVar18) {
                              pJVar37 = ppaJVar21[uVar25 + ~uVar38][uVar15];
                              uVar45 = 0;
                              do {
                                lVar29 = 0;
                                do {
                                  pJVar32[lVar29 * 4] = *(JCOEF *)((long)pJVar37 + lVar29);
                                  lVar29 = lVar29 + 2;
                                } while (lVar29 != 0x10);
                                lVar29 = 0x10;
                                do {
                                  pJVar32[lVar29 * 4 + -0x3f] = -*(short *)((long)pJVar37 + lVar29);
                                  lVar29 = lVar29 + 2;
                                } while (lVar29 != 0x20);
                                pJVar32 = pJVar32 + 2;
                                pJVar37 = pJVar37 + 0x10;
                                bVar52 = uVar45 < 6;
                                uVar45 = uVar45 + 2;
                              } while (bVar52);
                            }
                            else {
                              pJVar37 = ppaJVar21[uVar38][uVar15];
                              lVar29 = 0;
                              do {
                                lVar44 = 0;
                                do {
                                  pJVar32[lVar44 * 4] = *(JCOEF *)((long)pJVar37 + lVar44);
                                  lVar44 = lVar44 + 2;
                                } while (lVar44 != 0x10);
                                lVar29 = lVar29 + 1;
                                pJVar32 = pJVar32 + 1;
                                pJVar37 = pJVar37 + 8;
                              } while (lVar29 != 8);
                            }
                          }
                          uVar38 = uVar38 + 1;
                          uVar36 = (ulong)((int)uVar36 + 1);
                        } while (uVar38 != uVar25);
                      }
                      uVar39 = iVar34 + iVar1;
                      uVar36 = (ulong)uVar39;
                      uVar47 = pjVar5[lVar46].width_in_blocks;
                    } while (uVar39 < uVar47);
                    JVar23 = pjVar5[lVar46].v_samp_factor;
                  }
                  local_78 = local_78 + 1;
                  uVar15 = uVar15 + 1;
                } while (local_78 < (int)JVar23);
              }
              JVar48 = JVar48 + JVar23;
            } while (JVar48 < pjVar5[lVar46].height_in_blocks);
            iVar17 = dstinfo->num_components;
          }
          lVar46 = lVar46 + 1;
        } while (lVar46 < iVar17);
      }
      break;
    case JXFORM_ROT_90:
      uVar41 = srcinfo->output_height;
      iVar17 = dstinfo->num_components;
      iVar70 = dstinfo->max_h_samp_factor;
      if (0 < iVar17) {
        JVar27 = info->x_crop_offset;
        JVar16 = info->y_crop_offset;
        lVar46 = 0;
        do {
          pjVar5 = dstinfo->comp_info;
          if (pjVar5[lVar46].height_in_blocks != 0) {
            iVar17 = pjVar5[lVar46].h_samp_factor;
            JVar23 = pjVar5[lVar46].v_samp_factor;
            uVar31 = iVar17 * (uVar41 / (uint)(iVar70 << 3));
            iVar14 = JVar23 * JVar16;
            JVar48 = 0;
            do {
              ppaJVar20 = (*srcinfo->mem->access_virt_barray)
                                    ((j_common_ptr)srcinfo,ppjVar2[lVar46],JVar48,JVar23,1);
              JVar23 = pjVar5[lVar46].v_samp_factor;
              if (0 < (int)JVar23) {
                uVar18 = pjVar5[lVar46].width_in_blocks;
                uVar50 = iVar14 + JVar48;
                local_e8 = 0;
                do {
                  if (uVar18 == 0) {
                    uVar18 = 0;
                  }
                  else {
                    uVar25 = (ulong)(uint)pjVar5[lVar46].h_samp_factor;
                    uVar47 = 0;
                    do {
                      uVar18 = uVar47 + iVar17 * JVar27;
                      JVar23 = (uVar31 - uVar18) - (JDIMENSION)uVar25;
                      if (uVar31 <= uVar18) {
                        JVar23 = uVar18;
                      }
                      ppaJVar21 = (*srcinfo->mem->access_virt_barray)
                                            ((j_common_ptr)srcinfo,src_coef_arrays[lVar46],JVar23,
                                             (JDIMENSION)uVar25,0);
                      iVar40 = pjVar5[lVar46].h_samp_factor;
                      uVar25 = (ulong)iVar40;
                      if (0 < (long)uVar25) {
                        paJVar26 = ppaJVar20[local_e8];
                        uVar36 = 0;
                        uVar15 = uVar47;
                        do {
                          pJVar32 = paJVar26[uVar15];
                          if (uVar18 < uVar31) {
                            pJVar37 = ppaJVar21[uVar25 + ~uVar36][uVar50];
                            uVar38 = 0;
                            do {
                              lVar29 = 0;
                              do {
                                pJVar32[lVar29 * 4] = *(JCOEF *)((long)pJVar37 + lVar29);
                                lVar29 = lVar29 + 2;
                              } while (lVar29 != 0x10);
                              lVar29 = 0x10;
                              do {
                                pJVar32[lVar29 * 4 + -0x3f] = -*(short *)((long)pJVar37 + lVar29);
                                lVar29 = lVar29 + 2;
                              } while (lVar29 != 0x20);
                              pJVar32 = pJVar32 + 2;
                              pJVar37 = pJVar37 + 0x10;
                              bVar52 = uVar38 < 6;
                              uVar38 = uVar38 + 2;
                            } while (bVar52);
                          }
                          else {
                            pJVar37 = ppaJVar21[uVar36][uVar50];
                            lVar29 = 0;
                            do {
                              lVar44 = 0;
                              do {
                                pJVar32[lVar44 * 4] = *(JCOEF *)((long)pJVar37 + lVar44);
                                lVar44 = lVar44 + 2;
                              } while (lVar44 != 0x10);
                              lVar29 = lVar29 + 1;
                              pJVar32 = pJVar32 + 1;
                              pJVar37 = pJVar37 + 8;
                            } while (lVar29 != 8);
                          }
                          uVar36 = uVar36 + 1;
                          uVar15 = uVar15 + 1;
                        } while (uVar36 != uVar25);
                      }
                      uVar47 = uVar47 + iVar40;
                      uVar18 = pjVar5[lVar46].width_in_blocks;
                    } while (uVar47 < uVar18);
                    JVar23 = pjVar5[lVar46].v_samp_factor;
                  }
                  local_e8 = local_e8 + 1;
                  uVar50 = uVar50 + 1;
                } while (local_e8 < (int)JVar23);
              }
              JVar48 = JVar48 + JVar23;
            } while (JVar48 < pjVar5[lVar46].height_in_blocks);
            iVar17 = dstinfo->num_components;
          }
          lVar46 = lVar46 + 1;
        } while (lVar46 < iVar17);
      }
      break;
    case JXFORM_ROT_180:
      iVar17 = dstinfo->num_components;
      iVar70 = dstinfo->max_h_samp_factor;
      uVar41 = srcinfo->output_width;
      uVar31 = srcinfo->output_height;
      iVar14 = dstinfo->max_v_samp_factor;
      if (0 < iVar17) {
        JVar27 = info->x_crop_offset;
        JVar16 = info->y_crop_offset;
        lVar46 = 0;
        do {
          pjVar5 = dstinfo->comp_info;
          if (pjVar5[lVar46].height_in_blocks != 0) {
            JVar23 = pjVar5[lVar46].v_samp_factor;
            uVar47 = pjVar5[lVar46].h_samp_factor * (uVar41 / (uint)(iVar70 << 3));
            uVar18 = JVar23 * (uVar31 / (uint)(iVar14 << 3));
            uVar50 = pjVar5[lVar46].h_samp_factor * JVar27;
            iVar17 = JVar23 * JVar16;
            JVar48 = 0;
            do {
              ppaJVar20 = (*srcinfo->mem->access_virt_barray)
                                    ((j_common_ptr)srcinfo,ppjVar2[lVar46],JVar48,JVar23,1);
              uVar15 = iVar17 + JVar48;
              JVar23 = (uVar18 - uVar15) - pjVar5[lVar46].v_samp_factor;
              if (uVar18 <= uVar15) {
                JVar23 = uVar15;
              }
              ppaJVar21 = (*srcinfo->mem->access_virt_barray)
                                    ((j_common_ptr)srcinfo,src_coef_arrays[lVar46],JVar23,
                                     pjVar5[lVar46].v_samp_factor,0);
              JVar23 = pjVar5[lVar46].v_samp_factor;
              if (0 < (int)JVar23) {
                lVar29 = 0;
                do {
                  paJVar26 = ppaJVar20[lVar29];
                  if (uVar15 < uVar18) {
                    uVar35 = pjVar5[lVar46].width_in_blocks;
                    if ((ulong)uVar35 != 0) {
                      paJVar3 = ppaJVar21[(int)(~(uint)lVar29 + JVar23)];
                      uVar25 = 0;
                      do {
                        pJVar32 = paJVar26[uVar25];
                        uVar33 = uVar50 + (int)uVar25;
                        if (uVar33 < uVar47) {
                          pJVar37 = paJVar3[~uVar33 + uVar47];
                          uVar33 = 0;
                          do {
                            uVar39 = 0xfffffffe;
                            do {
                              *pJVar32 = *pJVar37;
                              pJVar42 = pJVar37 + 1;
                              pJVar37 = pJVar37 + 2;
                              pJVar32[1] = -*pJVar42;
                              pJVar32 = pJVar32 + 2;
                              uVar39 = uVar39 + 2;
                            } while (uVar39 < 6);
                            uVar39 = 0xfffffffe;
                            do {
                              *pJVar32 = -*pJVar37;
                              pJVar42 = pJVar37 + 1;
                              pJVar37 = pJVar37 + 2;
                              pJVar32[1] = *pJVar42;
                              pJVar32 = pJVar32 + 2;
                              uVar39 = uVar39 + 2;
                            } while (uVar39 < 6);
                            bVar52 = uVar33 < 6;
                            uVar33 = uVar33 + 2;
                          } while (bVar52);
                        }
                        else {
                          pJVar37 = paJVar3[uVar33];
                          uVar33 = 0;
                          do {
                            lVar44 = 0;
                            lVar43 = 0;
                            do {
                              pJVar32[lVar43] = pJVar37[lVar43];
                              lVar43 = lVar43 + 1;
                              lVar44 = lVar44 + -2;
                            } while ((int)lVar43 != 8);
                            pJVar32 = (JCOEF *)((long)pJVar32 - lVar44);
                            pJVar37 = (JCOEF *)((long)pJVar37 - lVar44);
                            iVar40 = 8;
                            do {
                              sVar13 = *pJVar37;
                              pJVar37 = pJVar37 + 1;
                              *pJVar32 = -sVar13;
                              pJVar32 = pJVar32 + 1;
                              iVar40 = iVar40 + -1;
                            } while (iVar40 != 0);
                            bVar52 = uVar33 < 6;
                            uVar33 = uVar33 + 2;
                          } while (bVar52);
                        }
                        uVar25 = uVar25 + 1;
                      } while (uVar25 != uVar35);
                    }
                  }
                  else {
                    uVar35 = pjVar5[lVar46].width_in_blocks;
                    if (uVar35 != 0) {
                      paJVar3 = ppaJVar21[lVar29];
                      uVar25 = 0;
                      do {
                        uVar33 = uVar50 + (int)uVar25;
                        if (uVar33 < uVar47) {
                          pJVar37 = paJVar26[uVar25];
                          pJVar32 = paJVar3[~uVar33 + uVar47];
                          uVar33 = 0xfffffffe;
                          do {
                            *pJVar37 = *pJVar32;
                            pJVar37[1] = -pJVar32[1];
                            pJVar37 = pJVar37 + 2;
                            uVar33 = uVar33 + 2;
                            pJVar32 = pJVar32 + 2;
                          } while (uVar33 < 0x3e);
                        }
                        else {
                          jcopy_block_row(paJVar3 + uVar50 + uVar25,paJVar26 + uVar25,1);
                          uVar35 = pjVar5[lVar46].width_in_blocks;
                        }
                        uVar25 = uVar25 + 1;
                      } while (uVar25 < uVar35);
                      JVar23 = pjVar5[lVar46].v_samp_factor;
                    }
                  }
                  lVar29 = lVar29 + 1;
                } while (lVar29 < (int)JVar23);
              }
              JVar48 = JVar48 + JVar23;
            } while (JVar48 < pjVar5[lVar46].height_in_blocks);
            iVar17 = dstinfo->num_components;
          }
          lVar46 = lVar46 + 1;
        } while (lVar46 < iVar17);
      }
      break;
    case JXFORM_ROT_270:
      uVar41 = srcinfo->output_width;
      iVar17 = dstinfo->num_components;
      iVar70 = dstinfo->max_v_samp_factor;
      if (0 < iVar17) {
        JVar27 = info->x_crop_offset;
        JVar16 = info->y_crop_offset;
        lVar46 = 0;
        do {
          pjVar5 = dstinfo->comp_info;
          if (pjVar5[lVar46].height_in_blocks != 0) {
            JVar23 = pjVar5[lVar46].v_samp_factor;
            uVar31 = JVar23 * (uVar41 / (uint)(iVar70 << 3));
            iVar17 = pjVar5[lVar46].h_samp_factor;
            iVar14 = JVar23 * JVar16;
            JVar48 = 0;
            do {
              ppaJVar20 = (*srcinfo->mem->access_virt_barray)
                                    ((j_common_ptr)srcinfo,ppjVar2[lVar46],JVar48,JVar23,1);
              JVar23 = pjVar5[lVar46].v_samp_factor;
              if (0 < (int)JVar23) {
                uVar47 = JVar48 + iVar14;
                uVar18 = pjVar5[lVar46].width_in_blocks;
                local_d8 = 0;
                uVar50 = uVar47;
                do {
                  if (uVar18 == 0) {
                    uVar18 = 0;
                  }
                  else {
                    uVar15 = ~((int)local_d8 + uVar47) + uVar31;
                    uVar25 = (ulong)(uint)pjVar5[lVar46].h_samp_factor;
                    uVar36 = 0;
                    do {
                      iVar34 = (int)uVar36;
                      ppaJVar21 = (*srcinfo->mem->access_virt_barray)
                                            ((j_common_ptr)srcinfo,src_coef_arrays[lVar46],
                                             iVar17 * JVar27 + iVar34,(JDIMENSION)uVar25,0);
                      iVar40 = pjVar5[lVar46].h_samp_factor;
                      uVar25 = (ulong)iVar40;
                      if (0 < (long)uVar25) {
                        paJVar26 = ppaJVar20[local_d8];
                        uVar38 = 0;
                        do {
                          paJVar3 = ppaJVar21[uVar38];
                          if (uVar47 < uVar31) {
                            pJVar32 = paJVar26[uVar36] + 8;
                            lVar29 = 0;
                            do {
                              uVar45 = 0xfffffffffffffffe;
                              uVar51 = 0;
                              pJVar37 = pJVar32;
                              do {
                                uVar28 = uVar51 | lVar29 * 8;
                                (*(JBLOCK *)(pJVar37 + -8))[0] = paJVar3[uVar15][uVar28];
                                *pJVar37 = -*(short *)((long)paJVar3[uVar15] + (uVar28 * 2 | 2));
                                uVar51 = uVar51 + 2;
                                uVar45 = uVar45 + 2;
                                pJVar37 = pJVar37 + 0x10;
                              } while (uVar45 < 6);
                              lVar29 = lVar29 + 1;
                              pJVar32 = pJVar32 + 1;
                            } while (lVar29 != 8);
                          }
                          else {
                            pJVar37 = paJVar26[uVar36];
                            pJVar32 = paJVar3[uVar50];
                            lVar29 = 0;
                            do {
                              lVar44 = 0;
                              do {
                                pJVar37[lVar44 * 4] = *(JCOEF *)((long)pJVar32 + lVar44);
                                lVar44 = lVar44 + 2;
                              } while (lVar44 != 0x10);
                              lVar29 = lVar29 + 1;
                              pJVar37 = pJVar37 + 1;
                              pJVar32 = pJVar32 + 8;
                            } while (lVar29 != 8);
                          }
                          uVar38 = uVar38 + 1;
                          uVar36 = (ulong)((int)uVar36 + 1);
                        } while (uVar38 != uVar25);
                      }
                      uVar35 = iVar34 + iVar40;
                      uVar36 = (ulong)uVar35;
                      uVar18 = pjVar5[lVar46].width_in_blocks;
                    } while (uVar35 < uVar18);
                    JVar23 = pjVar5[lVar46].v_samp_factor;
                  }
                  local_d8 = local_d8 + 1;
                  uVar50 = uVar50 + 1;
                } while (local_d8 < (int)JVar23);
              }
              JVar48 = JVar48 + JVar23;
            } while (JVar48 < pjVar5[lVar46].height_in_blocks);
            iVar17 = dstinfo->num_components;
          }
          lVar46 = lVar46 + 1;
        } while (lVar46 < iVar17);
      }
      break;
    case JXFORM_WIPE:
      JVar24 = info->crop_width_set;
      if (JVar24 == JCROP_REFLECT) {
        if ((info->y_crop_offset == 0) &&
           (JVar27 = info->drop_height,
           JVar16 = jdiv_round_up(info->output_height,(long)info->iMCU_sample_height),
           JVar27 == JVar16)) {
          JVar27 = info->x_crop_offset;
          if (JVar27 == 0) {
            JVar27 = 0;
LAB_001070f3:
            do_reflect(srcinfo,dstinfo,JVar27,src_coef_arrays,info->drop_width,info->drop_height);
            return;
          }
          JVar16 = info->drop_width;
          iVar17 = jdiv_round_up(info->output_width,(long)info->iMCU_sample_width);
          if (JVar27 + JVar16 == iVar17) {
            JVar27 = info->x_crop_offset;
            goto LAB_001070f3;
          }
        }
        JVar24 = info->crop_width_set;
      }
      JVar27 = info->x_crop_offset;
      JVar16 = info->y_crop_offset;
      JVar23 = info->drop_width;
      iVar17 = dstinfo->num_components;
      if (JVar24 == JCROP_FORCE) {
        if (0 < iVar17) {
          JVar48 = info->drop_height;
          lVar46 = 0;
          auVar64 = _DAT_0010a050;
          do {
            pjVar5 = dstinfo->comp_info;
            uVar41 = pjVar5[lVar46].v_samp_factor;
            uVar25 = (ulong)uVar41;
            JVar49 = uVar41 * JVar16;
            uVar41 = uVar41 * (JVar48 + JVar16);
            if (JVar49 < uVar41) {
              uVar31 = pjVar5[lVar46].h_samp_factor * JVar27;
              uVar18 = pjVar5[lVar46].h_samp_factor * JVar23;
              uVar36 = (ulong)uVar31;
              uVar50 = uVar18 + uVar31;
              uVar38 = (ulong)uVar50;
              lVar29 = (uVar38 - uVar36) + -1;
              auVar53._8_4_ = (int)lVar29;
              auVar53._0_8_ = lVar29;
              auVar53._12_4_ = (int)((ulong)lVar29 >> 0x20);
              auVar53 = auVar53 ^ auVar64;
              do {
                ppaJVar20 = (*srcinfo->mem->access_virt_barray)
                                      ((j_common_ptr)srcinfo,src_coef_arrays[lVar46],JVar49,
                                       (JDIMENSION)uVar25,1);
                uVar25 = (ulong)(uint)pjVar5[lVar46].v_samp_factor;
                if (0 < pjVar5[lVar46].v_samp_factor) {
                  lVar29 = 0;
                  do {
                    memset(ppaJVar20[lVar29] + uVar36,0,(ulong)uVar18 << 7);
                    auVar12 = _DAT_0010a050;
                    auVar11 = _DAT_0010a040;
                    auVar10 = _DAT_0010a030;
                    auVar9 = _DAT_0010a020;
                    auVar64 = _DAT_0010a010;
                    local_98 = auVar53._0_4_;
                    iStack_94 = auVar53._4_4_;
                    iStack_90 = auVar53._8_4_;
                    iStack_8c = auVar53._12_4_;
                    if (uVar31 == 0) {
                      if (uVar50 < pjVar5[lVar46].width_in_blocks) {
                        paJVar26 = ppaJVar20[lVar29];
                        sVar13 = paJVar26[uVar38][0];
                        goto LAB_00106cd7;
                      }
                    }
                    else {
                      paJVar26 = ppaJVar20[lVar29];
                      sVar13 = paJVar26[uVar31 - 1][0];
                      if (uVar50 < pjVar5[lVar46].width_in_blocks) {
                        sVar13 = (short)((uint)((int)paJVar26[uVar38][0] + (int)sVar13) >> 1);
                      }
LAB_00106cd7:
                      if (uVar31 < uVar50) {
                        paJVar26 = paJVar26 + uVar36 + 7;
                        uVar25 = 0;
                        do {
                          auVar63._8_4_ = (int)uVar25;
                          auVar63._0_8_ = uVar25;
                          auVar63._12_4_ = (int)(uVar25 >> 0x20);
                          auVar55 = (auVar63 | auVar11) ^ auVar12;
                          iVar17 = -(uint)(local_98 < auVar55._0_4_);
                          auVar56._4_4_ = -(uint)(iStack_94 < auVar55._4_4_);
                          iVar70 = -(uint)(iStack_90 < auVar55._8_4_);
                          auVar56._12_4_ = -(uint)(iStack_8c < auVar55._12_4_);
                          auVar66._4_4_ = iVar17;
                          auVar66._0_4_ = iVar17;
                          auVar66._8_4_ = iVar70;
                          auVar66._12_4_ = iVar70;
                          auVar71 = pshuflw(in_XMM4,auVar66,0xe8);
                          auVar58._4_4_ = -(uint)(auVar55._4_4_ == iStack_94);
                          auVar58._12_4_ = -(uint)(auVar55._12_4_ == iStack_8c);
                          auVar58._0_4_ = auVar58._4_4_;
                          auVar58._8_4_ = auVar58._12_4_;
                          auVar73 = pshuflw(in_XMM5,auVar58,0xe8);
                          auVar56._0_4_ = auVar56._4_4_;
                          auVar56._8_4_ = auVar56._12_4_;
                          auVar72 = pshuflw(auVar71,auVar56,0xe8);
                          auVar55._8_4_ = 0xffffffff;
                          auVar55._0_8_ = 0xffffffffffffffff;
                          auVar55._12_4_ = 0xffffffff;
                          auVar55 = (auVar72 | auVar73 & auVar71) ^ auVar55;
                          auVar55 = packssdw(auVar55,auVar55);
                          if ((auVar55 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                            paJVar26[-7][0] = sVar13;
                          }
                          auVar56 = auVar58 & auVar66 | auVar56;
                          auVar55 = packssdw(auVar56,auVar56);
                          auVar72._8_4_ = 0xffffffff;
                          auVar72._0_8_ = 0xffffffffffffffff;
                          auVar72._12_4_ = 0xffffffff;
                          auVar55 = packssdw(auVar55 ^ auVar72,auVar55 ^ auVar72);
                          if ((auVar55._0_4_ >> 0x10 & 1) != 0) {
                            paJVar26[-6][0] = sVar13;
                          }
                          auVar55 = (auVar63 | auVar10) ^ auVar12;
                          iVar17 = -(uint)(local_98 < auVar55._0_4_);
                          auVar69._4_4_ = -(uint)(iStack_94 < auVar55._4_4_);
                          iVar70 = -(uint)(iStack_90 < auVar55._8_4_);
                          auVar69._12_4_ = -(uint)(iStack_8c < auVar55._12_4_);
                          auVar57._4_4_ = iVar17;
                          auVar57._0_4_ = iVar17;
                          auVar57._8_4_ = iVar70;
                          auVar57._12_4_ = iVar70;
                          auVar65._4_4_ = -(uint)(auVar55._4_4_ == iStack_94);
                          auVar65._12_4_ = -(uint)(auVar55._12_4_ == iStack_8c);
                          auVar65._0_4_ = auVar65._4_4_;
                          auVar65._8_4_ = auVar65._12_4_;
                          auVar69._0_4_ = auVar69._4_4_;
                          auVar69._8_4_ = auVar69._12_4_;
                          auVar55 = auVar65 & auVar57 | auVar69;
                          auVar55 = packssdw(auVar55,auVar55);
                          auVar6._8_4_ = 0xffffffff;
                          auVar6._0_8_ = 0xffffffffffffffff;
                          auVar6._12_4_ = 0xffffffff;
                          auVar55 = packssdw(auVar55 ^ auVar6,auVar55 ^ auVar6);
                          if ((auVar55 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                            paJVar26[-5][0] = sVar13;
                          }
                          auVar58 = pshufhw(auVar57,auVar57,0x84);
                          auVar66 = pshufhw(auVar65,auVar65,0x84);
                          auVar56 = pshufhw(auVar58,auVar69,0x84);
                          auVar59._8_4_ = 0xffffffff;
                          auVar59._0_8_ = 0xffffffffffffffff;
                          auVar59._12_4_ = 0xffffffff;
                          auVar59 = (auVar56 | auVar66 & auVar58) ^ auVar59;
                          auVar58 = packssdw(auVar59,auVar59);
                          if ((auVar58 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0
                             ) {
                            paJVar26[-4][0] = sVar13;
                          }
                          auVar58 = (auVar63 | auVar9) ^ auVar12;
                          iVar17 = -(uint)(local_98 < auVar58._0_4_);
                          auVar61._4_4_ = -(uint)(iStack_94 < auVar58._4_4_);
                          iVar70 = -(uint)(iStack_90 < auVar58._8_4_);
                          auVar61._12_4_ = -(uint)(iStack_8c < auVar58._12_4_);
                          auVar67._4_4_ = iVar17;
                          auVar67._0_4_ = iVar17;
                          auVar67._8_4_ = iVar70;
                          auVar67._12_4_ = iVar70;
                          auVar55 = pshuflw(auVar55,auVar67,0xe8);
                          auVar60._4_4_ = -(uint)(auVar58._4_4_ == iStack_94);
                          auVar60._12_4_ = -(uint)(auVar58._12_4_ == iStack_8c);
                          auVar60._0_4_ = auVar60._4_4_;
                          auVar60._8_4_ = auVar60._12_4_;
                          in_XMM5 = pshuflw(auVar73 & auVar71,auVar60,0xe8);
                          in_XMM5 = in_XMM5 & auVar55;
                          auVar61._0_4_ = auVar61._4_4_;
                          auVar61._8_4_ = auVar61._12_4_;
                          auVar55 = pshuflw(auVar55,auVar61,0xe8);
                          auVar71._8_4_ = 0xffffffff;
                          auVar71._0_8_ = 0xffffffffffffffff;
                          auVar71._12_4_ = 0xffffffff;
                          auVar71 = (auVar55 | in_XMM5) ^ auVar71;
                          in_XMM4 = packssdw(auVar71,auVar71);
                          if ((in_XMM4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                            paJVar26[-3][0] = sVar13;
                          }
                          auVar61 = auVar60 & auVar67 | auVar61;
                          auVar55 = packssdw(auVar61,auVar61);
                          auVar73._8_4_ = 0xffffffff;
                          auVar73._0_8_ = 0xffffffffffffffff;
                          auVar73._12_4_ = 0xffffffff;
                          auVar55 = packssdw(auVar55 ^ auVar73,auVar55 ^ auVar73);
                          if ((auVar55 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                            paJVar26[-2][0] = sVar13;
                          }
                          auVar55 = (auVar63 | auVar64) ^ auVar12;
                          iVar17 = -(uint)(local_98 < auVar55._0_4_);
                          auVar68._4_4_ = -(uint)(iStack_94 < auVar55._4_4_);
                          iVar70 = -(uint)(iStack_90 < auVar55._8_4_);
                          auVar68._12_4_ = -(uint)(iStack_8c < auVar55._12_4_);
                          auVar62._4_4_ = iVar17;
                          auVar62._0_4_ = iVar17;
                          auVar62._8_4_ = iVar70;
                          auVar62._12_4_ = iVar70;
                          auVar54._4_4_ = -(uint)(auVar55._4_4_ == iStack_94);
                          auVar54._12_4_ = -(uint)(auVar55._12_4_ == iStack_8c);
                          auVar54._0_4_ = auVar54._4_4_;
                          auVar54._8_4_ = auVar54._12_4_;
                          auVar68._0_4_ = auVar68._4_4_;
                          auVar68._8_4_ = auVar68._12_4_;
                          auVar55 = auVar54 & auVar62 | auVar68;
                          auVar55 = packssdw(auVar55,auVar55);
                          auVar7._8_4_ = 0xffffffff;
                          auVar7._0_8_ = 0xffffffffffffffff;
                          auVar7._12_4_ = 0xffffffff;
                          auVar55 = packssdw(auVar55 ^ auVar7,auVar55 ^ auVar7);
                          if ((auVar55 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                            paJVar26[-1][0] = sVar13;
                          }
                          auVar63 = pshufhw(auVar62,auVar62,0x84);
                          auVar55 = pshufhw(auVar54,auVar54,0x84);
                          auVar58 = pshufhw(auVar63,auVar68,0x84);
                          auVar8._8_4_ = 0xffffffff;
                          auVar8._0_8_ = 0xffffffffffffffff;
                          auVar8._12_4_ = 0xffffffff;
                          auVar55 = packssdw(auVar55 & auVar63,
                                             (auVar58 | auVar55 & auVar63) ^ auVar8);
                          if ((auVar55 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0
                             ) {
                            (*paJVar26)[0] = sVar13;
                          }
                          uVar25 = uVar25 + 8;
                          paJVar26 = paJVar26 + 8;
                        } while (((uVar38 - uVar36) + 7 & 0xfffffffffffffff8) != uVar25);
                      }
                    }
                    lVar29 = lVar29 + 1;
                    uVar25 = (ulong)pjVar5[lVar46].v_samp_factor;
                  } while (lVar29 < (long)uVar25);
                }
                JVar49 = JVar49 + (int)uVar25;
              } while (JVar49 < uVar41);
              iVar17 = dstinfo->num_components;
              auVar64 = _DAT_0010a050;
            }
            lVar46 = lVar46 + 1;
          } while (lVar46 < iVar17);
        }
      }
      else if (0 < iVar17) {
        JVar48 = info->drop_height;
        lVar46 = 0;
        do {
          pjVar5 = dstinfo->comp_info;
          uVar41 = pjVar5[lVar46].v_samp_factor;
          uVar25 = (ulong)uVar41;
          JVar49 = uVar41 * JVar16;
          uVar41 = uVar41 * (JVar48 + JVar16);
          if (JVar49 < uVar41) {
            iVar17 = pjVar5[lVar46].h_samp_factor;
            do {
              ppaJVar20 = (*srcinfo->mem->access_virt_barray)
                                    ((j_common_ptr)srcinfo,src_coef_arrays[lVar46],JVar49,
                                     (JDIMENSION)uVar25,1);
              uVar25 = (ulong)(uint)pjVar5[lVar46].v_samp_factor;
              if (0 < pjVar5[lVar46].v_samp_factor) {
                lVar29 = 0;
                do {
                  memset(ppaJVar20[lVar29] + iVar17 * JVar27,0,(ulong)(iVar17 * JVar23) << 7);
                  lVar29 = lVar29 + 1;
                  uVar25 = (ulong)pjVar5[lVar46].v_samp_factor;
                } while (lVar29 < (long)uVar25);
              }
              JVar49 = JVar49 + (int)uVar25;
            } while (JVar49 < uVar41);
            iVar17 = dstinfo->num_components;
          }
          lVar46 = lVar46 + 1;
        } while (lVar46 < iVar17);
      }
      break;
    case JXFORM_DROP:
      JVar27 = info->drop_width;
      if (((JVar27 != 0) && (JVar16 = info->drop_height, JVar16 != 0)) &&
         (iVar17 = dstinfo->num_components, 0 < iVar17)) {
        JVar23 = info->x_crop_offset;
        JVar48 = info->y_crop_offset;
        pjVar4 = info->drop_ptr;
        ppjVar2 = info->drop_coef_arrays;
        lVar46 = 0;
        do {
          pjVar5 = dstinfo->comp_info;
          uVar41 = pjVar5[lVar46].v_samp_factor;
          uVar25 = (ulong)uVar41;
          uVar31 = uVar41 * JVar16;
          if (uVar31 != 0) {
            uVar18 = pjVar5[lVar46].h_samp_factor * JVar27;
            uVar50 = pjVar5[lVar46].h_samp_factor * JVar23;
            JVar49 = 0;
            do {
              ppaJVar20 = (*srcinfo->mem->access_virt_barray)
                                    ((j_common_ptr)srcinfo,src_coef_arrays[lVar46],
                                     uVar41 * JVar48 + JVar49,(JDIMENSION)uVar25,1);
              if (lVar46 < pjVar4->num_components) {
                ppaJVar21 = (*pjVar4->mem->access_virt_barray)
                                      ((j_common_ptr)pjVar4,ppjVar2[lVar46],JVar49,
                                       pjVar5[lVar46].v_samp_factor,0);
                uVar25 = (ulong)(uint)pjVar5[lVar46].v_samp_factor;
                if (0 < pjVar5[lVar46].v_samp_factor) {
                  lVar29 = 0;
                  do {
                    jcopy_block_row(ppaJVar21[lVar29],ppaJVar20[lVar29] + uVar50,uVar18);
                    lVar29 = lVar29 + 1;
                    uVar25 = (ulong)pjVar5[lVar46].v_samp_factor;
                  } while (lVar29 < (long)uVar25);
                }
              }
              else {
                uVar25 = (ulong)(uint)pjVar5[lVar46].v_samp_factor;
                if (0 < pjVar5[lVar46].v_samp_factor) {
                  lVar29 = 0;
                  do {
                    memset(ppaJVar20[lVar29] + uVar50,0,(ulong)uVar18 << 7);
                    lVar29 = lVar29 + 1;
                    uVar25 = (ulong)pjVar5[lVar46].v_samp_factor;
                  } while (lVar29 < (long)uVar25);
                }
              }
              JVar49 = JVar49 + (int)uVar25;
            } while (JVar49 < uVar31);
            iVar17 = dstinfo->num_components;
          }
          lVar46 = lVar46 + 1;
        } while (lVar46 < iVar17);
      }
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jtransform_execute_transform(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
                             jvirt_barray_ptr *src_coef_arrays,
                             jpeg_transform_info *info)
{
  jvirt_barray_ptr *dst_coef_arrays = info->workspace_coef_arrays;

  /* Note: conditions tested here should match those in switch statement
   * in jtransform_request_workspace()
   */
  switch (info->transform) {
  case JXFORM_NONE:
    if (info->output_width > srcinfo->output_width ||
        info->output_height > srcinfo->output_height) {
      if (info->output_width > srcinfo->output_width &&
          info->crop_width_set == JCROP_REFLECT)
        do_crop_ext_reflect(srcinfo, dstinfo,
                            info->x_crop_offset, info->y_crop_offset,
                            src_coef_arrays, dst_coef_arrays);
      else if (info->output_width > srcinfo->output_width &&
               info->crop_width_set == JCROP_FORCE)
        do_crop_ext_flat(srcinfo, dstinfo,
                         info->x_crop_offset, info->y_crop_offset,
                         src_coef_arrays, dst_coef_arrays);
      else
        do_crop_ext_zero(srcinfo, dstinfo,
                         info->x_crop_offset, info->y_crop_offset,
                         src_coef_arrays, dst_coef_arrays);
    } else if (info->x_crop_offset != 0 || info->y_crop_offset != 0)
      do_crop(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_FLIP_H:
    if (info->y_crop_offset != 0 || info->slow_hflip)
      do_flip_h(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
                src_coef_arrays, dst_coef_arrays);
    else
      do_flip_h_no_crop(srcinfo, dstinfo, info->x_crop_offset,
                        src_coef_arrays);
    break;
  case JXFORM_FLIP_V:
    do_flip_v(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_TRANSPOSE:
    do_transpose(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
                 src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_TRANSVERSE:
    do_transverse(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
                  src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_ROT_90:
    do_rot_90(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_ROT_180:
    do_rot_180(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
               src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_ROT_270:
    do_rot_270(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
               src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_WIPE:
    if (info->crop_width_set == JCROP_REFLECT &&
        info->y_crop_offset == 0 && info->drop_height ==
        (JDIMENSION)jdiv_round_up
          ((long)info->output_height, (long)info->iMCU_sample_height) &&
        (info->x_crop_offset == 0 ||
         info->x_crop_offset + info->drop_width ==
         (JDIMENSION)jdiv_round_up
           ((long)info->output_width, (long)info->iMCU_sample_width)))
      do_reflect(srcinfo, dstinfo, info->x_crop_offset,
                 src_coef_arrays, info->drop_width, info->drop_height);
    else if (info->crop_width_set == JCROP_FORCE)
      do_flatten(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
                 src_coef_arrays, info->drop_width, info->drop_height);
    else
      do_wipe(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, info->drop_width, info->drop_height);
    break;
  case JXFORM_DROP:
    if (info->drop_width != 0 && info->drop_height != 0)
      do_drop(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, info->drop_ptr, info->drop_coef_arrays,
              info->drop_width, info->drop_height);
    break;
  }
}